

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O0

bool __thiscall
cmCMakeHostSystemInformationCommand::InitialPass
          (cmCMakeHostSystemInformationCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  char *value_00;
  undefined1 local_120 [8];
  string value;
  string key;
  size_t i;
  string result_list;
  SystemInformation info;
  string local_a8;
  undefined1 local_88 [8];
  string variable;
  allocator local_51;
  string local_50;
  size_type local_30;
  size_t current_index;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCMakeHostSystemInformationCommand *this_local;
  
  local_30 = 0;
  current_index = (size_t)param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (local_30 + 2 <= sVar2) {
    pvVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,local_30);
    bVar1 = std::operator!=(pvVar3,"RESULT");
    if (!bVar1) {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,local_30 + 1);
      std::__cxx11::string::string((string *)local_88,(string *)pvVar3);
      local_30 = local_30 + 2;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local);
      if (sVar2 < local_30 + 2) {
LAB_006c8bbe:
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_a8,"missing QUERY specification",
                   (allocator *)((long)&info.Implementation + 7));
        cmCommand::SetError(&this->super_cmCommand,&local_a8);
        std::__cxx11::string::~string((string *)&local_a8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&info.Implementation + 7));
        this_local._7_1_ = 0;
        info.Implementation._0_4_ = 1;
      }
      else {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,local_30);
        bVar1 = std::operator!=(pvVar3,"QUERY");
        if (bVar1) goto LAB_006c8bbe;
        cmsys::SystemInformation::SystemInformation
                  ((SystemInformation *)((long)&result_list.field_2 + 8));
        cmsys::SystemInformation::RunCPUCheck((SystemInformation *)((long)&result_list.field_2 + 8))
        ;
        cmsys::SystemInformation::RunOSCheck((SystemInformation *)((long)&result_list.field_2 + 8));
        cmsys::SystemInformation::RunMemoryCheck
                  ((SystemInformation *)((long)&result_list.field_2 + 8));
        std::__cxx11::string::string((string *)&i);
        key.field_2._8_8_ = local_30;
        do {
          key.field_2._8_8_ = key.field_2._8_8_ + 1;
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)param_2_local);
          if (sVar2 <= (ulong)key.field_2._8_8_) {
            this_00 = (this->super_cmCommand).Makefile;
            value_00 = (char *)std::__cxx11::string::c_str();
            cmMakefile::AddDefinition(this_00,(string *)local_88,value_00);
            this_local._7_1_ = 1;
            info.Implementation._0_4_ = 1;
            break;
          }
          pvVar3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,key.field_2._8_8_);
          std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8),(string *)pvVar3);
          if (key.field_2._8_8_ != local_30 + 1) {
            std::__cxx11::string::operator+=((string *)&i,";");
          }
          std::__cxx11::string::string((string *)local_120);
          bVar1 = GetValue(this,(SystemInformation *)((long)&result_list.field_2 + 8),
                           (string *)((long)&value.field_2 + 8),(string *)local_120);
          if (bVar1) {
            std::__cxx11::string::operator+=((string *)&i,(string *)local_120);
          }
          else {
            this_local._7_1_ = 0;
          }
          info.Implementation._1_3_ = 0;
          info.Implementation._0_1_ = !bVar1;
          std::__cxx11::string::~string((string *)local_120);
          std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
        } while ((uint)info.Implementation == 0);
        std::__cxx11::string::~string((string *)&i);
        cmsys::SystemInformation::~SystemInformation
                  ((SystemInformation *)((long)&result_list.field_2 + 8));
      }
      std::__cxx11::string::~string((string *)local_88);
      goto LAB_006c8ed8;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"missing RESULT specification.",&local_51);
  cmCommand::SetError(&this->super_cmCommand,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  this_local._7_1_ = 0;
LAB_006c8ed8:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCMakeHostSystemInformationCommand
::InitialPass(std::vector<std::string> const &args, cmExecutionStatus &)
{
  size_t current_index = 0;

  if(args.size() < (current_index + 2) || args[current_index] != "RESULT")
    {
    this->SetError("missing RESULT specification.");
    return false;
    }

  std::string variable = args[current_index + 1];
  current_index += 2;

  if(args.size() < (current_index + 2) || args[current_index] != "QUERY")
    {
    this->SetError("missing QUERY specification");
    return false;
    }

  cmsys::SystemInformation info;
  info.RunCPUCheck();
  info.RunOSCheck();
  info.RunMemoryCheck();

  std::string result_list;
  for(size_t i = current_index + 1; i < args.size(); ++i)
    {
    std::string key = args[i];
    if(i != current_index + 1)
      {
      result_list += ";";
      }
    std::string value;
    if(!this->GetValue(info, key, value)) return false;

    result_list += value;
    }

  this->Makefile->AddDefinition(variable, result_list.c_str());

  return true;
}